

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O2

bool __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::disconnect
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this,
          size_t connection)

{
  SignalLink *pSVar1;
  SignalLink *this_00;
  
  pSVar1 = this->callback_ring_;
  if (pSVar1 == (SignalLink *)0x0) {
    return false;
  }
  this_00 = pSVar1->next;
  if (pSVar1->next == (SignalLink *)0x0) {
    this_00 = pSVar1;
  }
  do {
    if (this_00 == pSVar1) {
LAB_0019aae6:
      return this_00 != pSVar1;
    }
    if (this_00 == (SignalLink *)connection) {
      SignalLink::unlink(this_00,(char *)connection);
      goto LAB_0019aae6;
    }
    this_00 = this_00->next;
  } while( true );
}

Assistant:

bool disconnect(size_t connection) {
    return callback_ring_ ? callback_ring_->remove_sibling(connection) : false;
  }